

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O3

void __thiscall pbrt::semantic::PBRTInfo::PBRTInfo(PBRTInfo *this,SP *scene)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  element_type *peVar3;
  undefined8 *puVar4;
  _Base_ptr this_00;
  ostream *poVar5;
  int *piVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  matsUsedByType;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  it;
  undefined1 local_a8 [32];
  _Rb_tree_node_base *local_88;
  size_t local_80;
  key_type local_78;
  _Rb_tree_color local_58;
  _Base_ptr local_50;
  SP local_48;
  SP *local_38;
  
  p_Var1 = &(this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header;
  (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(this,0,0x110);
  (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50 = &(this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_50;
  (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_50;
  (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar3 = (scene->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar3->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar3->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  traverse(this,&local_48);
  if (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pcVar2 = local_a8 + 0x10;
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"objects","");
  Counter::print(&this->numObjects,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"areaLights","");
  Counter::print(&this->numAreaLights,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"shapes","");
  Counter::print(&this->numShapes,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"triangles","");
  Counter::print(&this->numTriangles,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"quads","");
  Counter::print(&this->numQuads,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"disks","");
  Counter::print(&this->numDisks,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"spheres","");
  Counter::print(&this->numSpheres,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"curves","");
  Counter::print(&this->numCurves,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"curve segments","");
  Counter::print(&this->numCurveSegments,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"lights","");
  Counter::print(&this->numLights,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"point lights","");
  Counter::print(&this->numPointLights,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"spot lights","");
  Counter::print(&this->numSpotLights,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"distant lights","");
  Counter::print(&this->numDistantLights,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"infinite lights","");
  Counter::print(&this->numInfiniteLights,(string *)local_a8);
  local_38 = scene;
  if ((pointer)local_a8._0_8_ != pcVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"total num materials ",0x14);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_a8._24_8_ = local_a8 + 8;
  local_a8._8_4_ = _S_red;
  local_a8._16_8_ = 0;
  local_80 = 0;
  p_Var7 = (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88 = (_Rb_tree_node_base *)local_a8._24_8_;
  if (p_Var7 != local_50) {
    do {
      puVar4 = *(undefined8 **)(p_Var7 + 1);
      this_00 = p_Var7[1]._M_parent;
      if (this_00 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        }
      }
      if (puVar4 == (undefined8 *)0x0) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"null","");
        piVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_a8,&local_78);
      }
      else {
        (**(code **)*puVar4)(&local_78);
        piVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_a8,&local_78);
      }
      *piVar6 = *piVar6 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if (this_00 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"material usage by type:",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  if ((_Rb_tree_node_base *)local_a8._24_8_ != (_Rb_tree_node_base *)(local_a8 + 8)) {
    p_Var8 = (_Rb_tree_node_base *)local_a8._24_8_;
    do {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,*(long *)(p_Var8 + 1),
                 (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
      local_58 = p_Var8[2]._M_color;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - ",3);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"x\t",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != (_Rb_tree_node_base *)(local_a8 + 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"scene bounds ",0xd);
  (*(((((local_38->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->world).
      super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Entity).
    _vptr_Entity[3])(&local_78);
  poVar5 = math::operator<<((ostream *)&std::cout,(box3f *)&local_78);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_a8);
  return;
}

Assistant:

PBRTInfo(Scene::SP scene)
      {
        traverse(scene->world);
        numObjects.print("objects");
        numAreaLights.print("areaLights");
        numShapes.print("shapes");
        numTriangles.print("triangles");
        numQuads.print("quads");
        numDisks.print("disks");
        numSpheres.print("spheres");
        numCurves.print("curves");
        numCurveSegments.print("curve segments");
        numLights.print("lights");
        numPointLights.print("point lights");
        numSpotLights.print("spot lights");
        numDistantLights.print("distant lights");
        numInfiniteLights.print("infinite lights");
        std::cout << "total num materials " << usedMaterials.size() << std::endl;
        std::map<std::string,int> matsUsedByType;
        for (auto mat : usedMaterials)
          if (mat)
            matsUsedByType[mat->toString()]++;
          else
            matsUsedByType["null"]++;
            
        std::cout << "material usage by type:" << std::endl;
        for (auto it : matsUsedByType)
          std::cout << " - " << it.second << "x\t" << it.first << std::endl;
        std::cout << "scene bounds " << scene->getBounds() << std::endl;
      }